

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

int __thiscall
google::protobuf::internal::GeneratedMessageReflection::FieldSize
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  Type TVar4;
  RepeatedField<double> *pRVar5;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar6;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x50] != (FieldDescriptor)0x1) {
    TVar4 = FieldDescriptor::type(field);
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4)) {
    case 1:
    case 8:
      pRVar5 = (RepeatedField<double> *)
               GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      break;
    case 2:
      pRVar5 = (RepeatedField<double> *)
               GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      break;
    case 3:
      pRVar5 = (RepeatedField<double> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      break;
    case 4:
      pRVar5 = (RepeatedField<double> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      break;
    case 5:
      pRVar5 = GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      break;
    case 6:
      pRVar5 = (RepeatedField<double> *)
               GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      break;
    case 7:
      pRVar5 = (RepeatedField<double> *)
               GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      break;
    case 9:
    case 10:
      bVar1 = FieldDescriptor::is_map(field);
      if (bVar1) {
        this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        pRVar6 = MapFieldBase::GetRepeatedField(this_00);
      }
      else {
        pRVar6 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      }
      return pRVar6->current_size_;
    default:
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2fd);
      other = LogMessage::operator<<(&local_50,"Can\'t get here.");
      LogFinisher::operator=(&local_51,other);
      LogMessage::~LogMessage(&local_50);
      return 0;
    }
    return pRVar5->current_size_;
  }
  uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  iVar3 = ExtensionSet::ExtensionSize
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                     *(int *)(field + 0x38));
  return iVar3;
}

Assistant:

int GeneratedMessageReflection::FieldSize(const Message& message,
                                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          return GetRaw<MapFieldBase>(message, field).GetRepeatedField().size();
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}